

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorBuilder::LookupSymbolNoPlaceholder
          (DescriptorBuilder *this,string *name,string *relative_to,ResolveMode resolve_mode,
          bool build_it)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  Symbol SVar7;
  undefined4 uStack_f4;
  size_type old_size;
  size_type dot_pos;
  string scope_to_try;
  string local_90 [8];
  string first_part_of_name;
  size_type name_dot_pos;
  string local_58;
  byte local_35;
  ResolveMode local_34;
  bool build_it_local;
  string *psStack_30;
  ResolveMode resolve_mode_local;
  string *relative_to_local;
  string *name_local;
  DescriptorBuilder *this_local;
  Symbol result;
  
  this->possible_undeclared_dependency_ = (FileDescriptor *)0x0;
  local_35 = build_it;
  local_34 = resolve_mode;
  psStack_30 = relative_to;
  relative_to_local = name;
  name_local = (string *)this;
  std::__cxx11::string::clear();
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)relative_to_local), *pcVar4 == '.'))
  {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)relative_to_local);
    SVar7 = FindSymbol(this,&local_58,(bool)(local_35 & 1));
    result._0_8_ = SVar7.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    first_part_of_name.field_2._8_8_ =
         std::__cxx11::string::find_first_of((char)relative_to_local,0x2e);
    std::__cxx11::string::string(local_90);
    if (first_part_of_name.field_2._8_8_ == -1) {
      std::__cxx11::string::operator=(local_90,(string *)relative_to_local);
    }
    else {
      std::__cxx11::string::substr
                ((ulong)((long)&scope_to_try.field_2 + 8),(ulong)relative_to_local);
      std::__cxx11::string::operator=(local_90,(string *)(scope_to_try.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(scope_to_try.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::string((string *)&dot_pos,(string *)psStack_30);
    while (uVar3 = std::__cxx11::string::find_last_of((char)&dot_pos,0x2e),
          uVar3 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)&dot_pos,uVar3);
      uVar3 = std::__cxx11::string::size();
      std::__cxx11::string::append((ulong)&dot_pos,'\x01');
      std::__cxx11::string::append((string *)&dot_pos);
      SVar7 = FindSymbol(this,(string *)&dot_pos,(bool)(local_35 & 1));
      result._0_8_ = SVar7.field_1;
      this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
      bVar2 = Symbol::IsNull((Symbol *)&this_local);
      if (!bVar2) {
        uVar5 = std::__cxx11::string::size();
        uVar6 = std::__cxx11::string::size();
        if (uVar5 < uVar6) {
          bVar2 = Symbol::IsAggregate((Symbol *)&this_local);
          psVar1 = relative_to_local;
          if (bVar2) {
            uVar3 = std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::size();
            std::__cxx11::string::append((string *)&dot_pos,(ulong)psVar1,uVar3);
            SVar7 = FindSymbol(this,(string *)&dot_pos,(bool)(local_35 & 1));
            result._0_8_ = SVar7.field_1;
            this_local = (DescriptorBuilder *)CONCAT44(uStack_f4,SVar7.type);
            bVar2 = Symbol::IsNull((Symbol *)&this_local);
            if (bVar2) {
              std::__cxx11::string::operator=
                        ((string *)&this->undefine_resolved_name_,(string *)&dot_pos);
            }
            goto LAB_004da467;
          }
        }
        else if ((local_34 != LOOKUP_TYPES) ||
                (bVar2 = Symbol::IsType((Symbol *)&this_local), bVar2)) goto LAB_004da467;
      }
      std::__cxx11::string::erase((ulong)&dot_pos,uVar3);
    }
    SVar7 = FindSymbol(this,relative_to_local,(bool)(local_35 & 1));
    result._0_8_ = SVar7.field_1;
    this_local = (DescriptorBuilder *)CONCAT44(this_local._4_4_,SVar7.type);
LAB_004da467:
    std::__cxx11::string::~string((string *)&dot_pos);
    std::__cxx11::string::~string(local_90);
  }
  SVar7._0_8_ = (ulong)this_local & 0xffffffff;
  SVar7.field_1 = (anon_union_8_8_13f84498_for_Symbol_2)result._0_8_;
  return SVar7;
}

Assistant:

Symbol DescriptorBuilder::LookupSymbolNoPlaceholder(const string& name,
                                                    const string& relative_to,
                                                    ResolveMode resolve_mode,
                                                    bool build_it) {
  possible_undeclared_dependency_ = NULL;
  undefine_resolved_name_.clear();

  if (!name.empty() && name[0] == '.') {
    // Fully-qualified name.
    return FindSymbol(name.substr(1), build_it);
  }

  // If name is something like "Foo.Bar.baz", and symbols named "Foo" are
  // defined in multiple parent scopes, we only want to find "Bar.baz" in the
  // innermost one.  E.g., the following should produce an error:
  //   message Bar { message Baz {} }
  //   message Foo {
  //     message Bar {
  //     }
  //     optional Bar.Baz baz = 1;
  //   }
  // So, we look for just "Foo" first, then look for "Bar.baz" within it if
  // found.
  string::size_type name_dot_pos = name.find_first_of('.');
  string first_part_of_name;
  if (name_dot_pos == string::npos) {
    first_part_of_name = name;
  } else {
    first_part_of_name = name.substr(0, name_dot_pos);
  }

  string scope_to_try(relative_to);

  while (true) {
    // Chop off the last component of the scope.
    string::size_type dot_pos = scope_to_try.find_last_of('.');
    if (dot_pos == string::npos) {
      return FindSymbol(name, build_it);
    } else {
      scope_to_try.erase(dot_pos);
    }

    // Append ".first_part_of_name" and try to find.
    string::size_type old_size = scope_to_try.size();
    scope_to_try.append(1, '.');
    scope_to_try.append(first_part_of_name);
    Symbol result = FindSymbol(scope_to_try, build_it);
    if (!result.IsNull()) {
      if (first_part_of_name.size() < name.size()) {
        // name is a compound symbol, of which we only found the first part.
        // Now try to look up the rest of it.
        if (result.IsAggregate()) {
          scope_to_try.append(name, first_part_of_name.size(),
                              name.size() - first_part_of_name.size());
          result = FindSymbol(scope_to_try, build_it);
          if (result.IsNull()) {
            undefine_resolved_name_ = scope_to_try;
          }
          return result;
        } else {
          // We found a symbol but it's not an aggregate.  Continue the loop.
        }
      } else {
        if (resolve_mode == LOOKUP_TYPES && !result.IsType()) {
          // We found a symbol but it's not a type.  Continue the loop.
        } else {
          return result;
        }
      }
    }

    // Not found.  Remove the name so we can try again.
    scope_to_try.erase(old_size);
  }
}